

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O2

CEPlanet * CEPlanet::Mercury(void)

{
  CEPlanet *in_RDI;
  allocator local_69;
  CEAngle local_68;
  CEAngle local_58;
  CESkyCoordType local_44;
  string local_40;
  double local_20;
  double local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Mercury",&local_69);
  local_18 = 0.0;
  CEAngle::CEAngle(&local_58,&local_18);
  local_20 = 0.0;
  CEAngle::CEAngle(&local_68,&local_20);
  local_44 = CIRS;
  CEPlanet(in_RDI,&local_40,&local_58,&local_68,&local_44);
  CEAngle::~CEAngle(&local_68);
  CEAngle::~CEAngle(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_69);
  SetSemiMajorAxis_AU(in_RDI,0.38709843,0.0);
  SetEccentricity(in_RDI,0.20563661,2.123e-05);
  SetInclination(in_RDI,7.00559432,-0.00590158,DEGREES);
  SetMeanLongitude(in_RDI,252.25166724,149472.67486623,DEGREES);
  SetPerihelionLongitude(in_RDI,77.45771895,0.15940013,DEGREES);
  SetAscendingNodeLongitude(in_RDI,48.33961819,-0.12214182,DEGREES);
  SetMeanRadius_m(in_RDI,2440000.0);
  SetAlbedo(in_RDI,0.106);
  SetMass_kg(in_RDI,3.302e+23);
  local_40._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  SetSofaID(in_RDI,(double *)&local_40);
  return in_RDI;
}

Assistant:

CEPlanet CEPlanet::Mercury()
{
    CEPlanet mercury("Mercury", 0.0, 0.0) ;
    mercury.SetSemiMajorAxis_AU(0.38709843, 0.0) ;
    mercury.SetEccentricity(0.20563661, 0.00002123) ;
    mercury.SetInclination(7.00559432, -0.00590158, CEAngleType::DEGREES) ;
    mercury.SetMeanLongitude(252.25166724, 149472.67486623, CEAngleType::DEGREES) ;
    mercury.SetPerihelionLongitude(77.45771895, 0.15940013, CEAngleType::DEGREES) ;
    mercury.SetAscendingNodeLongitude(48.33961819, -0.12214182, CEAngleType::DEGREES) ;
    
    // Set planet characteristics
    mercury.SetMeanRadius_m(2440000.0) ;
    mercury.SetAlbedo(0.106) ;
    mercury.SetMass_kg(3.302E23) ;
    
    // Set the sofa planet ID
    mercury.SetSofaID(1) ;
    
    return mercury ;
}